

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_function_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateFastFieldEntries
          (ParseFunctionGenerator *this,Formatter *format)

{
  string_view suffix;
  bool bVar1;
  FileOptions_OptimizeMode FVar2;
  pointer pTVar3;
  LogMessage *pLVar4;
  FileDescriptor *file;
  Descriptor *this_00;
  undefined1 split;
  char *pcVar5;
  uint16_t *args_1;
  uint8_t *args_2;
  uint8_t *args_3;
  TcParseFunction func;
  TcParseFunction extraout_DL;
  TcParseFunction extraout_DL_00;
  TcParseFunction func_00;
  Descriptor *descriptor;
  string_view sVar6;
  char (*in_stack_fffffffffffffc58) [4];
  char *local_358;
  char *local_350;
  LogMessage local_308;
  Voidify local_2f1;
  string local_2f0;
  undefined1 local_2d0 [80];
  string local_280;
  AlphaNum local_260;
  AlphaNum local_230;
  AlphaNum local_200;
  AlphaNum local_1d0;
  string local_1a0;
  allocator<char> local_179;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  string_view local_168;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  string_view local_148;
  undefined1 local_138 [8];
  string field_type;
  string_view local_f8;
  string_view local_e8;
  string_view local_d8;
  string_view local_c8;
  undefined1 local_b8 [8];
  string func_name;
  LogMessage local_90;
  Voidify local_79;
  Field *local_78;
  Field *as_field;
  string local_60;
  NonField *local_40;
  NonField *nonfield;
  FastFieldInfo *info;
  iterator __end3;
  iterator __begin3;
  vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  *__range3;
  Formatter *format_local;
  ParseFunctionGenerator *this_local;
  
  pTVar3 = std::
           unique_ptr<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           ::operator->(&this->tc_table_info_);
  __end3 = std::
           vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
           ::begin(&pTVar3->fast_path_fields);
  info = (FastFieldInfo *)
         std::
         vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
         ::end(&pTVar3->fast_path_fields);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo_*,_std::vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>_>
                                *)&info);
    if (!bVar1) {
      return;
    }
    nonfield = (NonField *)
               __gnu_cxx::
               __normal_iterator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo_*,_std::vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>_>
               ::operator*(&__end3);
    local_40 = protobuf::internal::TailCallTableInfo::FastFieldInfo::AsNonField
                         ((FastFieldInfo *)nonfield);
    if (local_40 == (NonField *)0x0) {
      local_78 = protobuf::internal::TailCallTableInfo::FastFieldInfo::AsField
                           ((FastFieldInfo *)nonfield);
      if (local_78 == (Field *)0x0) {
        bVar1 = protobuf::internal::TailCallTableInfo::FastFieldInfo::is_empty
                          ((FastFieldInfo *)nonfield);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_308,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/parse_function_generator.cc"
                     ,0x280,"info.is_empty()");
          pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_308);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_2f1,pLVar4);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_308);
        }
        Formatter::operator()<>(format,"{::_pbi::TcParser::MiniParse, {}},\n");
      }
      else {
        PrintFieldComment<google::protobuf::FieldDescriptor>(format,local_78->field,this->options_);
        bVar1 = ShouldSplit(local_78->field,this->options_);
        func_name.field_2._M_local_buf[0xf] = '\0';
        func_00 = extraout_DL;
        if (bVar1) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_90,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/parse_function_generator.cc"
                     ,0x260,"!ShouldSplit(as_field->field, options_)");
          func_name.field_2._M_local_buf[0xf] = '\x01';
          pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar4);
          func_00 = extraout_DL_00;
        }
        if ((func_name.field_2._M_local_buf[0xf] & 1U) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_90);
        }
        TcParseFunctionName_abi_cxx11_((string *)local_b8,(cpp *)(ulong)local_78->func,func_00);
        file = FieldDescriptor::file(local_78->field);
        FVar2 = GetOptimizeFor(file,this->options_);
        if (FVar2 == FileOptions_OptimizeMode_SPEED) {
          sVar6 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_b8);
          local_c8 = sVar6;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d8,"V8S1")
          ;
          bVar1 = absl::lts_20250127::EndsWith(local_c8,local_d8);
          if (!bVar1) {
            sVar6 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_b8);
            local_e8 = sVar6;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_f8,"V32S1");
            bVar1 = absl::lts_20250127::EndsWith(local_e8,local_f8);
            if (!bVar1) {
              sVar6 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_b8);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         ((long)&field_type.field_2 + 8),"V64S1");
              bVar1 = absl::lts_20250127::EndsWith(sVar6,stack0xfffffffffffffee8);
              if (!bVar1) goto LAB_016e0c5b;
            }
          }
          sVar6 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_b8);
          local_148 = sVar6;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_158,"V8S1");
          sVar6._M_str = local_158._M_str;
          sVar6._M_len = local_158._M_len;
          pcVar5 = local_158._M_str;
          bVar1 = absl::lts_20250127::EndsWith(local_148,sVar6);
          split = SUB81(pcVar5,0);
          if (bVar1) {
            local_350 = "bool";
          }
          else {
            sVar6 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_b8);
            local_168 = sVar6;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_178,"V32S1");
            suffix._M_str = local_178._M_str;
            suffix._M_len = local_178._M_len;
            pcVar5 = local_178._M_str;
            bVar1 = absl::lts_20250127::EndsWith(local_168,suffix);
            split = SUB81(pcVar5,0);
            if (bVar1) {
              local_358 = "::uint32_t";
            }
            else {
              local_358 = "::uint64_t";
            }
            local_350 = local_358;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_138,local_350,&local_179);
          std::allocator<char>::~allocator(&local_179);
          absl::lts_20250127::AlphaNum::AlphaNum
                    (&local_1d0,"::_pbi::TcParser::SingularVarintNoZag1<");
          absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                    (&local_200,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138)
          ;
          absl::lts_20250127::AlphaNum::AlphaNum(&local_230,", offsetof(");
          this_00 = FieldDescriptor::containing_type(local_78->field);
          ClassName_abi_cxx11_(&local_280,(cpp *)this_00,descriptor);
          absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_260,&local_280);
          absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)(local_2d0 + 0x20),", ");
          FieldMemberName_abi_cxx11_
                    ((string *)local_2d0,(cpp *)local_78->field,(FieldDescriptor *)0x0,(bool)split);
          absl::lts_20250127::StrCat<std::__cxx11::string,char[4],unsigned_char,char[4]>
                    (&local_1a0,(lts_20250127 *)&local_1d0,&local_200,&local_230,&local_260,
                     (AlphaNum *)(local_2d0 + 0x20),(AlphaNum *)local_2d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f9bd5f,
                     (char (*) [4])&local_78->hasbit_idx,">()",in_stack_fffffffffffffc58);
          std::__cxx11::string::operator=((string *)local_b8,(string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)local_2d0);
          std::__cxx11::string::~string((string *)&local_280);
          std::__cxx11::string::~string((string *)local_138);
        }
LAB_016e0c5b:
        args_1 = &local_78->coded_tag;
        args_2 = &local_78->hasbit_idx;
        args_3 = &local_78->aux_idx;
        FieldMemberName_abi_cxx11_
                  (&local_2f0,(cpp *)local_78->field,(FieldDescriptor *)0x0,SUB81(args_3,0));
        Formatter::operator()
                  (format,"{$1$,\n {$2$, $3$, $4$, PROTOBUF_FIELD_OFFSET($classname$, $5$)}},\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   args_1,args_2,args_3,&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)local_b8);
      }
    }
    else {
      TcParseFunctionName_abi_cxx11_(&local_60,(cpp *)(ulong)local_40->func,func);
      Formatter::operator()
                (format,"{$1$, {$2$, $3$}},\n",&local_60,&local_40->coded_tag,
                 &local_40->nonfield_info);
      std::__cxx11::string::~string((string *)&local_60);
    }
    __gnu_cxx::
    __normal_iterator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo_*,_std::vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>_>
    ::operator++(&__end3);
  } while( true );
}

Assistant:

void ParseFunctionGenerator::GenerateFastFieldEntries(Formatter& format) {
  for (const auto& info : tc_table_info_->fast_path_fields) {
    if (auto* nonfield = info.AsNonField()) {
      // Fast slot that is not associated with a field. Eg end group tags.
      format("{$1$, {$2$, $3$}},\n", TcParseFunctionName(nonfield->func),
             nonfield->coded_tag, nonfield->nonfield_info);
    } else if (auto* as_field = info.AsField()) {
      PrintFieldComment(format, as_field->field, options_);
      ABSL_CHECK(!ShouldSplit(as_field->field, options_));

      std::string func_name = TcParseFunctionName(as_field->func);
      if (GetOptimizeFor(as_field->field->file(), options_) ==
          FileOptions::SPEED) {
        // For 1-byte tags we have a more optimized version of the varint parser
        // that can hardcode the offset and has bit.
        if (absl::EndsWith(func_name, "V8S1") ||
            absl::EndsWith(func_name, "V32S1") ||
            absl::EndsWith(func_name, "V64S1")) {
          std::string field_type = absl::EndsWith(func_name, "V8S1") ? "bool"
                                   : absl::EndsWith(func_name, "V32S1")
                                       ? "::uint32_t"
                                       : "::uint64_t";
          func_name = absl::StrCat(
              "::_pbi::TcParser::SingularVarintNoZag1<", field_type,
              ", offsetof(",                                      //
              ClassName(as_field->field->containing_type()),      //
              ", ",                                               //
              FieldMemberName(as_field->field, /*split=*/false),  //
              "), ",                                              //
              as_field->hasbit_idx,                               //
              ">()");
        }
      }

      format(
          "{$1$,\n"
          " {$2$, $3$, $4$, PROTOBUF_FIELD_OFFSET($classname$, $5$)}},\n",
          func_name, as_field->coded_tag, as_field->hasbit_idx,
          as_field->aux_idx, FieldMemberName(as_field->field, /*split=*/false));
    } else {
      ABSL_DCHECK(info.is_empty());
      format("{::_pbi::TcParser::MiniParse, {}},\n");
    }
  }
}